

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::CombinedUniformComponentsCase::iterate
          (CombinedUniformComponentsCase *this)

{
  ostringstream *this_00;
  TestLog *log;
  bool bVar1;
  ContextType ctxType;
  int iVar2;
  GLenum GVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  allocator<char> local_2c1;
  CallLogWrapper gl;
  StateQueryMemoryWriteGuard<int> maxUniformComponents;
  StateQueryMemoryWriteGuard<int> maxUniformBlockSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  StateQueryMemoryWriteGuard<int> maxUniformBlocks;
  code *local_200;
  GLenum local_1f8;
  ResultCollector result;
  undefined1 local_1a0 [384];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)(this->m_minimumVersion).m_bits);
  if (bVar1) {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    glu::CallLogWrapper::CallLogWrapper
              (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
    log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a0," // ERROR: ",(allocator<char> *)&local_290);
    tcu::ResultCollector::ResultCollector(&result,log,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    GVar4 = this->m_target;
    if (GVar4 == 0x8266) {
      GVar4 = 0x8263;
      GVar3 = 0x91bb;
    }
    else if (GVar4 == 0x8e1f) {
      GVar4 = 0x8e80;
      GVar3 = 0x8e8a;
    }
    else if (GVar4 == 0x8e1e) {
      GVar4 = 0x8e7f;
      GVar3 = 0x8e89;
    }
    else {
      GVar3 = -(uint)(GVar4 != 0x8a32) | 0x8a2c;
      GVar4 = -(uint)(GVar4 != 0x8a32) | 0x8ddf;
    }
    gl.m_enableLog = true;
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "The minimum value of MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS is MAX_COMPUTE_UNIFORM_BLOCKS x MAX_UNIFORM_BLOCK_SIZE / 4 + MAX_COMPUTE_UNIFORM_COMPONENTS"
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              (&maxUniformBlocks);
    glu::CallLogWrapper::glGetIntegerv(&gl,GVar3,&maxUniformBlocks.m_value);
    GVar3 = glu::CallLogWrapper::glGetError(&gl);
    if (GVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"Got Error ",(allocator<char> *)&maxUniformBlockSize);
      local_200 = glu::getErrorName;
      local_1f8 = GVar3;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_200);
      std::operator+(&local_230,&local_250,&local_270);
      std::operator+(&local_290,&local_230,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     &local_290,"glGetIntegerv");
      tcu::ResultCollector::fail(&result,(string *)local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_250);
    }
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              (&maxUniformBlockSize);
    glu::CallLogWrapper::glGetIntegerv(&gl,0x8a30,&maxUniformBlockSize.m_value);
    GVar3 = glu::CallLogWrapper::glGetError(&gl);
    if (GVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"Got Error ",(allocator<char> *)&maxUniformComponents);
      local_200 = glu::getErrorName;
      local_1f8 = GVar3;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_200);
      std::operator+(&local_230,&local_250,&local_270);
      std::operator+(&local_290,&local_230,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     &local_290,"glGetIntegerv");
      tcu::ResultCollector::fail(&result,(string *)local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_250);
    }
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              (&maxUniformComponents);
    glu::CallLogWrapper::glGetIntegerv(&gl,GVar4,&maxUniformComponents.m_value);
    GVar4 = glu::CallLogWrapper::glGetError(&gl);
    if (GVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"Got Error ",&local_2c1);
      local_200 = glu::getErrorName;
      local_1f8 = GVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_200);
      std::operator+(&local_230,&local_250,&local_270);
      std::operator+(&local_290,&local_230,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     &local_290,"glGetIntegerv");
      tcu::ResultCollector::fail(&result,(string *)local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_250);
    }
    bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                      (&maxUniformBlocks,&result);
    if (bVar1) {
      bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                        (&maxUniformBlockSize,&result);
      if (bVar1) {
        bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                          (&maxUniformComponents,&result);
        if (bVar1) {
          deqp::gls::StateQueryUtil::verifyStateIntegerMin
                    (&result,&gl,this->m_target,
                     (maxUniformBlockSize.m_value * maxUniformBlocks.m_value) / 4 +
                     maxUniformComponents.m_value,this->m_verifierType);
        }
      }
    }
    tcu::ResultCollector::setTestContextResult
              (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::ResultCollector::~ResultCollector(&result);
    glu::CallLogWrapper::~CallLogWrapper(&gl);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Test not supported in this context.",
             "contextSupports(m_context.getRenderContext().getType(), m_minimumVersion)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIntegerStateQueryTests.cpp"
             ,0x1ff);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

CombinedUniformComponentsCase::IterateResult CombinedUniformComponentsCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(m_context.getRenderContext().getType(), m_minimumVersion), "Test not supported in this context.");

	glu::CallLogWrapper		gl							(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result						(m_testCtx.getLog(), " // ERROR: ");

	const glw::GLenum		maxUniformBlocksEnum		= (m_target == GL_MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS) ? GL_MAX_COMPUTE_UNIFORM_BLOCKS
														: (m_target == GL_MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS) ? GL_MAX_TESS_CONTROL_UNIFORM_BLOCKS
														: (m_target == GL_MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS) ? GL_MAX_TESS_EVALUATION_UNIFORM_BLOCKS
														: (m_target == GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS) ? GL_MAX_GEOMETRY_UNIFORM_BLOCKS
														: -1;

	const glw::GLenum		maxUniformComponentsEnum	= (m_target == GL_MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS) ? GL_MAX_COMPUTE_UNIFORM_COMPONENTS
														: (m_target == GL_MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS) ? GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS
														: (m_target == GL_MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS) ? GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS
														: (m_target == GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS) ? GL_MAX_GEOMETRY_UNIFORM_COMPONENTS
														: -1;

	gl.enableLogging(true);

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "The minimum value of MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS is MAX_COMPUTE_UNIFORM_BLOCKS x MAX_UNIFORM_BLOCK_SIZE / 4 + MAX_COMPUTE_UNIFORM_COMPONENTS"
						<< tcu::TestLog::EndMessage;

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlocks;
	gl.glGetIntegerv(maxUniformBlocksEnum, &maxUniformBlocks);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlockSize;
	gl.glGetIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &maxUniformBlockSize);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformComponents;
	gl.glGetIntegerv(maxUniformComponentsEnum, &maxUniformComponents);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	if (maxUniformBlocks.verifyValidity(result) && maxUniformBlockSize.verifyValidity(result) && maxUniformComponents.verifyValidity(result))
		verifyStateIntegerMin(result, gl, m_target, ((int)maxUniformBlocks) * ((int)maxUniformBlockSize) / 4 + (int)maxUniformComponents, m_verifierType);

	result.setTestContextResult(m_testCtx);
	return STOP;
}